

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_splitter.hpp
# Opt level: O0

void pstore::dump::
     expand_tabs<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               out,size_t tab_size)

{
  bool bVar1;
  reference pcVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  char local_59;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  unsigned_long local_48;
  size_t spaces;
  char local_31;
  ulong uStack_30;
  char c;
  size_t position;
  size_t tab_size_local;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  uStack_30 = 0;
  position = tab_size;
  tab_size_local = (size_t)out.container;
  out_local.container =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&out_local);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&last_local);
    local_31 = *pcVar2;
    if (local_31 == '\t') {
      local_48 = position - uStack_30 % position;
      local_58 = tab_size_local;
      local_59 = ' ';
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::fill_n<std::back_insert_iterator<std::__cxx11::string>,unsigned_long,char>
                           ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )tab_size_local,local_48,&local_59);
      uStack_30 = local_48 + uStack_30;
      tab_size_local = (size_t)local_50;
    }
    else {
      spaces = (size_t)std::
                       back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&tab_size_local,0);
      this = std::
             back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&spaces);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(this,&local_31);
      uStack_30 = uStack_30 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&last_local);
  }
  return;
}

Assistant:

void expand_tabs (InputIterator first, InputIterator last, OutputIterator out,
                          std::size_t const tab_size = 4) {
            auto position = std::size_t{0};
            for (; first != last; ++first) {
                auto const c = *first;
                if (c != '\t') {
                    *(out++) = c;
                    ++position;
                } else {
                    auto const spaces = tab_size - (position % tab_size);
                    out = std::fill_n (out, spaces, ' ');
                    position += spaces;
                }
            }
        }